

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

char * CBS_asn1_oid_to_text(CBS *cbs)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint64_t v;
  size_t sVar4;
  byte *pbVar5;
  bool bVar6;
  uint8_t *txt;
  CBB cbb;
  size_t txt_len;
  uint8_t *local_68;
  CBB local_60;
  size_t local_30;
  
  pbVar5 = cbs->data;
  sVar4 = cbs->len;
  iVar2 = CBB_init(&local_60,0x20);
  if (iVar2 != 0) {
    uVar3 = 0;
    do {
      bVar6 = sVar4 == 0;
      sVar4 = sVar4 - 1;
      if ((bVar6) || (0x1ffffffffffffff < uVar3)) goto LAB_00173fe0;
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      uVar3 = uVar3 << 7 | (ulong)(bVar1 & 0x7f);
    } while ((char)bVar1 < '\0');
    if (uVar3 < 0x50) {
      iVar2 = add_decimal(&local_60,(ulong)(0x27 < uVar3));
      if ((iVar2 == 0) || (iVar2 = CBB_add_u8(&local_60,'.'), iVar2 == 0)) goto LAB_00173fe0;
      v = uVar3 - 0x28;
      if (uVar3 < 0x28) {
        v = uVar3;
      }
    }
    else {
      iVar2 = CBB_add_bytes(&local_60,(uint8_t *)"2.",2);
      if (iVar2 == 0) goto LAB_00173fe0;
      v = uVar3 - 0x50;
    }
    iVar2 = add_decimal(&local_60,v);
    if (iVar2 != 0) {
      while (sVar4 != 0) {
        uVar3 = 0;
        do {
          bVar6 = sVar4 == 0;
          sVar4 = sVar4 - 1;
          if ((bVar6) || (0x1ffffffffffffff < uVar3)) goto LAB_00173fe0;
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar3 = (ulong)(bVar1 & 0x7f) | uVar3 << 7;
        } while ((char)bVar1 < '\0');
        iVar2 = CBB_add_u8(&local_60,'.');
        if ((iVar2 == 0) || (iVar2 = add_decimal(&local_60,uVar3), iVar2 == 0)) goto LAB_00173fe0;
      }
      iVar2 = CBB_add_u8(&local_60,'\0');
      if ((iVar2 != 0) && (iVar2 = CBB_finish(&local_60,&local_68,&local_30), iVar2 != 0)) {
        return (char *)local_68;
      }
    }
  }
LAB_00173fe0:
  CBB_cleanup(&local_60);
  return (char *)0x0;
}

Assistant:

char *CBS_asn1_oid_to_text(const CBS *cbs) {
  CBS copy = *cbs;
  CBB cbb;
  if (!CBB_init(&cbb, 32)) {
    goto err;
  }

  // The first component is 40 * value1 + value2, where value1 is 0, 1, or 2.
  uint64_t v;
  if (!parse_base128_integer(&copy, &v)) {
    goto err;
  }

  if (v >= 80) {
    if (!CBB_add_bytes(&cbb, (const uint8_t *)"2.", 2) ||
        !add_decimal(&cbb, v - 80)) {
      goto err;
    }
  } else if (!add_decimal(&cbb, v / 40) || !CBB_add_u8(&cbb, '.') ||
             !add_decimal(&cbb, v % 40)) {
    goto err;
  }

  while (CBS_len(&copy) != 0) {
    if (!parse_base128_integer(&copy, &v) || !CBB_add_u8(&cbb, '.') ||
        !add_decimal(&cbb, v)) {
      goto err;
    }
  }

  uint8_t *txt;
  size_t txt_len;
  if (!CBB_add_u8(&cbb, '\0') || !CBB_finish(&cbb, &txt, &txt_len)) {
    goto err;
  }

  return (char *)txt;

err:
  CBB_cleanup(&cbb);
  return NULL;
}